

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O1

void __thiscall xLearn::Model::Shrink(Model *this)

{
  if (this->param_best_w_ != (real_t *)0x0) {
    memcpy(this->param_w_,this->param_best_w_,(ulong)this->param_num_w_ << 2);
  }
  if (this->param_best_v_ != (real_t *)0x0) {
    memcpy(this->param_v_,this->param_best_v_,(ulong)this->param_num_v_ << 2);
  }
  if (this->param_best_b_ != (real_t *)0x0) {
    memcpy(this->param_b_,this->param_best_b_,(ulong)this->aux_size_ << 2);
    return;
  }
  return;
}

Assistant:

void Model::Shrink() {
  // Copy best model parameters
  if (param_best_w_ != nullptr) {
    memcpy(param_w_, param_best_w_, param_num_w_*sizeof(real_t));
  }
  if (param_best_v_ != nullptr) {
    memcpy(param_v_, param_best_v_, param_num_v_*sizeof(real_t));
  }
  if (param_best_b_ != nullptr) {
    memcpy(param_b_, param_best_b_, aux_size_*sizeof(real_t));
  }
}